

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  Descriptor *type;
  Message *pMVar4;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  MessageLite *this_00;
  UnknownFieldSet *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  scoped_ptr<google::protobuf::Message> dynamic;
  string serial;
  AggregateErrorCollector collector;
  LogMessage local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Parser parser;
  AggregateOptionFinder finder;
  
  if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 4) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finder,
                   "Option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    std::operator+(&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finder,
                   "\" is a message. To set the entire message, use syntax like \"");
    std::operator+(&serial,&local_88,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    option_field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                   &serial,
                   " = { <proto text format> }\". To set fields within it, use syntax like \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collector,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parser,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    option_field);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collector,
                   ".foo = value\".");
    bVar1 = AddValueError(this,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&collector);
    std::__cxx11::string::~string((string *)&parser);
    std::__cxx11::string::~string((string *)&serial);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&finder);
  }
  else {
    type = FieldDescriptor::message_type(option_field);
    pMVar4 = DynamicMessageFactory::GetPrototype(&this->dynamic_factory_,type);
    iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])(pMVar4);
    dynamic.ptr_ = (Message *)CONCAT44(extraout_var,iVar2);
    if (dynamic.ptr_ == (Message *)0x0) {
      internal::LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1995);
      pLVar5 = internal::LogMessage::operator<<(&local_c0,"CHECK failed: dynamic.get() != NULL: ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"Could not create an instance of ");
      FieldDescriptor::DebugString_abi_cxx11_((string *)&collector,option_field);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)&collector);
      internal::LogFinisher::operator=((LogFinisher *)&parser,pLVar5);
      std::__cxx11::string::~string((string *)&collector);
      internal::LogMessage::~LogMessage(&local_c0);
    }
    collector.error_._M_dataplus._M_p = (pointer)&collector.error_.field_2;
    collector.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__AggregateErrorCollector_00771ac0;
    collector.error_._M_string_length = 0;
    collector.error_.field_2._M_local_buf[0] = '\0';
    finder.super_Finder._vptr_Finder = (_func_int **)&PTR__Finder_00771b08;
    finder.builder_ = this->builder_;
    TextFormat::Parser::Parser(&parser);
    parser.error_collector_ = &collector.super_ErrorCollector;
    parser.finder_ = &finder.super_Finder;
    bVar1 = TextFormat::Parser::ParseFromString
                      (&parser,(this->uninterpreted_option_->aggregate_value_).ptr_,dynamic.ptr_);
    if (bVar1) {
      serial._M_dataplus._M_p = (pointer)&serial.field_2;
      serial._M_string_length = 0;
      serial.field_2._M_local_buf[0] = '\0';
      this_00 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&dynamic)->
                 super_MessageLite;
      MessageLite::SerializeToString(this_00,&serial);
      TVar3 = FieldDescriptor::type(option_field);
      if (TVar3 == TYPE_MESSAGE) {
        UnknownFieldSet::AddLengthDelimited(unknown_fields,*(int *)(option_field + 0x38),&serial);
      }
      else {
        TVar3 = FieldDescriptor::type(option_field);
        if (TVar3 != TYPE_GROUP) {
          internal::LogMessage::LogMessage
                    (&local_c0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x19a9);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_c0,
                              "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                             );
          internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar5);
          internal::LogMessage::~LogMessage(&local_c0);
        }
        this_01 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)(option_field + 0x38));
        UnknownFieldSet::ParseFromString(this_01,&serial);
      }
      this_02 = &serial;
    }
    else {
      std::operator+(&local_88,"Error while parsing option value for \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      std::operator+(&serial,&local_88,"\": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                     &serial,&collector.error_);
      AddValueError(this,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&serial);
      this_02 = &local_88;
    }
    std::__cxx11::string::~string((string *)this_02);
    TextFormat::Parser::~Parser(&parser);
    TextFormat::Finder::~Finder(&finder.super_Finder);
    anon_unknown_1::AggregateErrorCollector::~AggregateErrorCollector(&collector);
    if (dynamic.ptr_ != (Message *)0x0) {
      (*((dynamic.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" + option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" + option_field->name() +
                         ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  google::protobuf::scoped_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != NULL)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(),  FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}